

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.h
# Opt level: O0

void __thiscall gui::MultilineTextBox::~MultilineTextBox(MultilineTextBox *this)

{
  Widget *in_RDI;
  vector<sf::RectangleShape,_std::allocator<sf::RectangleShape>_> *unaff_retaddr;
  
  (in_RDI->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__MultilineTextBox_0047fa00;
  std::vector<sf::RectangleShape,_std::allocator<sf::RectangleShape>_>::~vector(unaff_retaddr);
  sf::String::~String((String *)0x26111e);
  std::vector<sf::String,_std::allocator<sf::String>_>::~vector
            ((vector<sf::String,_std::allocator<sf::String>_> *)unaff_retaddr);
  std::vector<sf::String,_std::allocator<sf::String>_>::~vector
            ((vector<sf::String,_std::allocator<sf::String>_> *)unaff_retaddr);
  sf::String::~String((String *)0x261151);
  std::shared_ptr<gui::MultilineTextBoxStyle>::~shared_ptr
            ((shared_ptr<gui::MultilineTextBoxStyle> *)0x261162);
  Signal<gui::Widget_*,_unsigned_long>::~Signal((Signal<gui::Widget_*,_unsigned_long> *)0x261173);
  Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::~Signal
            ((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)0x261184);
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::~Signal
            ((Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&> *)0x261195);
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::~Signal
            ((Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&> *)0x2611a6);
  Widget::~Widget(in_RDI);
  return;
}

Assistant:

virtual ~MultilineTextBox() = default;